

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Watcher.hpp
# Opt level: O0

void __thiscall efsw::Watcher::~Watcher(Watcher *this)

{
  Watcher *this_local;
  
  ~Watcher(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~Watcher() {}